

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_AtoI_Test::~TEST_SimpleString_AtoI_Test(TEST_SimpleString_AtoI_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00364e78;
  MemoryLeakAllocator::~MemoryLeakAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator
              .super_TestMemoryAllocator);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, AtoI)
{
    char max_short_str[] = "32767";
    char min_short_str[] = "-32768";

    CHECK(12345  == SimpleString::AtoI("012345"));
    CHECK(6789   == SimpleString::AtoI("6789"));
    CHECK(12345  == SimpleString::AtoI("12345/"));
    CHECK(12345  == SimpleString::AtoI("12345:"));
    CHECK(-12345 == SimpleString::AtoI("-12345"));
    CHECK(123    == SimpleString::AtoI("\t \r\n123"));
    CHECK(123    == SimpleString::AtoI("123-foo"));
    CHECK(0      == SimpleString::AtoI("-foo"));
    CHECK(-32768 == SimpleString::AtoI(min_short_str));
    CHECK(32767  == SimpleString::AtoI(max_short_str));
}